

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btScaledBvhTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
btScaledBvhTriangleMeshShape::processAllTriangles
          (btScaledBvhTriangleMeshShape *this,btTriangleCallback *callback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  btScaledTriangleCallback scaledCallback;
  btVector3 scaledAabbMax;
  btVector3 scaledAabbMin;
  btTriangleCallback local_48;
  btTriangleCallback *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  float local_20;
  undefined4 local_1c;
  undefined8 local_18;
  float local_10;
  undefined4 local_c;
  
  local_48._vptr_btTriangleCallback = (_func_int **)&PTR__btTriangleCallback_0021e8f0;
  local_38 = *(undefined8 *)(this->m_localScaling).m_floats;
  uStack_30 = *(undefined8 *)((this->m_localScaling).m_floats + 2);
  fVar1 = (this->m_localScaling).m_floats[2];
  uVar2 = *(ulong *)(this->m_localScaling).m_floats;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  auVar7 = divps(_DAT_001ee3f0,auVar7);
  fVar6 = (float)(uVar2 >> 0x20);
  uVar4 = -(uint)((float)uVar2 < 0.0);
  uVar5 = -(uint)(fVar6 < 0.0);
  uVar8 = (uint)*(undefined8 *)aabbMax->m_floats;
  uVar9 = (uint)((ulong)*(undefined8 *)aabbMax->m_floats >> 0x20);
  uVar10 = (uint)*(undefined8 *)aabbMin->m_floats;
  uVar11 = (uint)((ulong)*(undefined8 *)aabbMin->m_floats >> 0x20);
  uVar3 = CONCAT44(~uVar5 & uVar11,~uVar4 & uVar10) | CONCAT44(uVar9 & uVar5,uVar8 & uVar4);
  local_18 = CONCAT44((float)(uVar3 >> 0x20) * auVar7._4_4_,(float)uVar3 * auVar7._0_4_);
  local_10 = (float)(~-(uint)(fVar1 < 0.0) & (uint)aabbMin->m_floats[2] |
                    -(uint)(fVar1 < 0.0) & (uint)aabbMax->m_floats[2]) * (1.0 / fVar1);
  local_c = 0;
  uVar4 = -(uint)(0.0 < (float)uVar2);
  uVar5 = -(uint)(0.0 < fVar6);
  uVar2 = CONCAT44(~uVar5 & uVar11,~uVar4 & uVar10) | CONCAT44(uVar9 & uVar5,uVar8 & uVar4);
  local_28 = CONCAT44((float)(uVar2 >> 0x20) * auVar7._4_4_,(float)uVar2 * auVar7._0_4_);
  local_20 = (float)(~-(uint)(0.0 < fVar1) & (uint)aabbMin->m_floats[2] |
                    (uint)aabbMax->m_floats[2] & -(uint)(0.0 < fVar1)) * (1.0 / fVar1);
  local_1c = 0;
  local_40 = callback;
  (*(this->m_bvhTriMeshShape->super_btTriangleMeshShape).super_btConcaveShape.super_btCollisionShape
    ._vptr_btCollisionShape[0x10])();
  btTriangleCallback::~btTriangleCallback(&local_48);
  return;
}

Assistant:

void	btScaledBvhTriangleMeshShape::processAllTriangles(btTriangleCallback* callback,const btVector3& aabbMin,const btVector3& aabbMax) const
{
	btScaledTriangleCallback scaledCallback(callback,m_localScaling);
	
	btVector3 invLocalScaling(1.f/m_localScaling.getX(),1.f/m_localScaling.getY(),1.f/m_localScaling.getZ());
	btVector3 scaledAabbMin,scaledAabbMax;

	///support negative scaling
	scaledAabbMin[0] = m_localScaling.getX() >= 0. ? aabbMin[0] * invLocalScaling[0] : aabbMax[0] * invLocalScaling[0];
	scaledAabbMin[1] = m_localScaling.getY() >= 0. ? aabbMin[1] * invLocalScaling[1] : aabbMax[1] * invLocalScaling[1];
	scaledAabbMin[2] = m_localScaling.getZ() >= 0. ? aabbMin[2] * invLocalScaling[2] : aabbMax[2] * invLocalScaling[2];
	scaledAabbMin[3] = 0.f;
	
	scaledAabbMax[0] = m_localScaling.getX() <= 0. ? aabbMin[0] * invLocalScaling[0] : aabbMax[0] * invLocalScaling[0];
	scaledAabbMax[1] = m_localScaling.getY() <= 0. ? aabbMin[1] * invLocalScaling[1] : aabbMax[1] * invLocalScaling[1];
	scaledAabbMax[2] = m_localScaling.getZ() <= 0. ? aabbMin[2] * invLocalScaling[2] : aabbMax[2] * invLocalScaling[2];
	scaledAabbMax[3] = 0.f;
	
	
	m_bvhTriMeshShape->processAllTriangles(&scaledCallback,scaledAabbMin,scaledAabbMax);
}